

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_31::WebSocketImpl::queuePong(WebSocketImpl *this,Array<unsigned_char> *payload)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Disposer *pDVar4;
  AsyncIoStream *pAVar5;
  PromiseNode *pPVar6;
  TransformPromiseNodeBase *this_00;
  Own<kj::_::ChainPromiseNode> OVar7;
  Promise<void> PVar8;
  Own<kj::_::PromiseNode> local_88;
  undefined1 local_78 [32];
  undefined8 local_58;
  size_t sStack_50;
  ArrayDisposer *local_48;
  Disposer *local_38;
  PromiseNode *local_30;
  
  if (this->currentlySending == true) {
    if ((this->queuedPong).ptr.isSet == true) {
      (this->queuedPong).ptr.isSet = false;
      puVar1 = (this->queuedPong).ptr.field_1.value.ptr;
      if (puVar1 != (uchar *)0x0) {
        sVar2 = (this->queuedPong).ptr.field_1.value.size_;
        (this->queuedPong).ptr.field_1.value.ptr = (uchar *)0x0;
        (this->queuedPong).ptr.field_1.value.size_ = 0;
        pAVar3 = (this->queuedPong).ptr.field_1.value.disposer;
        (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,1,sVar2,sVar2,0);
      }
    }
    (this->queuedPong).ptr.field_1.value.ptr = payload->ptr;
    (this->queuedPong).ptr.field_1.value.size_ = payload->size_;
    (this->queuedPong).ptr.field_1.value.disposer = payload->disposer;
    payload->ptr = (uchar *)0x0;
    payload->size_ = 0;
    (this->queuedPong).ptr.isSet = true;
  }
  else if ((this->sendingPong).ptr.isSet == true) {
    pDVar4 = (Disposer *)payload->ptr;
    pAVar5 = (AsyncIoStream *)payload->size_;
    pAVar3 = payload->disposer;
    payload->ptr = (uchar *)0x0;
    payload->size_ = 0;
    local_78._0_8_ = this;
    local_78._8_8_ = pDVar4;
    local_78._16_8_ = pAVar5;
    local_78._24_8_ = pAVar3;
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&(this->sendingPong).ptr.field_1.value,
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2467:58),_kj::Array<unsigned_char>_>
               ::operator()<>);
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00442940;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
    this_00[1].dependency.disposer = pDVar4;
    this_00[1].dependency.ptr = (PromiseNode *)pAVar5;
    this_00[1].continuationTracePtr = pAVar3;
    local_78._8_8_ = (Disposer *)0x0;
    local_78._16_8_ = (AsyncIoStream *)0x0;
    local_88.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::CaptureByMove<kj::(anonymous_namespace)::WebSocketImpl::queuePong(kj::Array<unsigned_char>)::{lambda(kj::Array<unsigned_char>)#1},kj::Array<unsigned_char>>,kj::_::PropagateException>>
          ::instance;
    local_88.ptr = (PromiseNode *)this_00;
    OVar7 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_38,&local_88);
    pPVar6 = local_88.ptr;
    if ((TransformPromiseNodeBase *)local_88.ptr != (TransformPromiseNodeBase *)0x0) {
      local_88.ptr = (PromiseNode *)0x0;
      (**(local_88.disposer)->_vptr_Disposer)
                (local_88.disposer,
                 (_func_int *)
                 ((long)&((PromiseNode *)&pPVar6->_vptr_PromiseNode)->_vptr_PromiseNode +
                 (long)((PromiseNode *)&pPVar6->_vptr_PromiseNode)->_vptr_PromiseNode[-2]),OVar7.ptr
                );
    }
    if ((this->sendingPong).ptr.isSet == true) {
      (this->sendingPong).ptr.isSet = false;
      pPVar6 = (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.ptr;
      if (pPVar6 != (PromiseNode *)0x0) {
        (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        pDVar4 = (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.disposer;
        (**pDVar4->_vptr_Disposer)
                  (pDVar4,(_func_int *)
                          ((long)&pPVar6->_vptr_PromiseNode + (long)pPVar6->_vptr_PromiseNode[-2]));
      }
    }
    (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.disposer = local_38;
    (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.ptr = local_30;
    (this->sendingPong).ptr.isSet = true;
  }
  else {
    local_58 = payload->ptr;
    sStack_50 = payload->size_;
    local_48 = payload->disposer;
    payload->ptr = (uchar *)0x0;
    payload->size_ = 0;
    PVar8 = sendPong((WebSocketImpl *)local_78,(Array<unsigned_char> *)this);
    if ((this->sendingPong).ptr.isSet == true) {
      (this->sendingPong).ptr.isSet = false;
      pPVar6 = (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.ptr;
      if (pPVar6 != (PromiseNode *)0x0) {
        (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        pDVar4 = (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.disposer;
        (**pDVar4->_vptr_Disposer)
                  (pDVar4,(_func_int *)
                          ((long)&pPVar6->_vptr_PromiseNode + (long)pPVar6->_vptr_PromiseNode[-2]),
                   PVar8.super_PromiseBase.node.ptr);
      }
    }
    sVar2 = sStack_50;
    puVar1 = local_58;
    (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.disposer =
         (Disposer *)local_78._0_8_;
    (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)local_78._8_8_
    ;
    local_78._8_8_ = (Disposer *)0x0;
    (this->sendingPong).ptr.isSet = true;
    if (local_58 != (uchar *)0x0) {
      local_58._0_1_ = false;
      local_58._1_1_ = false;
      local_58._2_1_ = false;
      local_58._3_1_ = '\0';
      local_58._4_1_ = '\0';
      local_58._5_1_ = '\0';
      local_58._6_1_ = '\0';
      local_58._7_1_ = '\0';
      sStack_50._0_1_ = '\0';
      sStack_50._1_1_ = '\0';
      sStack_50._2_1_ = '\0';
      sStack_50._3_1_ = '\0';
      sStack_50._4_1_ = '\0';
      sStack_50._5_1_ = '\0';
      sStack_50._6_1_ = '\0';
      sStack_50._7_1_ = '\0';
      (**local_48->_vptr_ArrayDisposer)(local_48,puVar1,1,sVar2,sVar2,0);
    }
  }
  return;
}

Assistant:

void queuePong(kj::Array<byte> payload) {
    if (currentlySending) {
      // There is a message-send in progress, so we cannot write to the stream now.
      //
      // Note: According to spec, if the server receives a second ping before responding to the
      //   previous one, it can opt to respond only to the last ping. So we don't have to check if
      //   queuedPong is already non-null.
      queuedPong = kj::mv(payload);
    } else KJ_IF_MAYBE(promise, sendingPong) {
      // We're still sending a previous pong. Wait for it to finish before sending ours.
      sendingPong = promise->then(kj::mvCapture(payload, [this](kj::Array<byte> payload) mutable {
        return sendPong(kj::mv(payload));
      }));
    } else {
      // We're not sending any pong currently.
      sendingPong = sendPong(kj::mv(payload));
    }